

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::InvalidTargetTest::InvalidTargetTest(InvalidTargetTest *this,Context *context)

{
  vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  *this_00;
  GLenum GVar1;
  long lVar2;
  GLuint src;
  uint uVar3;
  GLenum src_target;
  long lVar4;
  testCase test_case;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"invalid_target",
             "Test verifies if INVALID_ENUM is generated when invalid target is provided to CopySubImageData"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InvalidTargetTest_01db4c40;
  this_00 = &this->m_test_cases;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  for (lVar2 = 0; lVar2 != 0xb; lVar2 = lVar2 + 1) {
    GVar1 = (&s_valid_targets)[lVar2];
    uVar3 = 0xfffffffb;
    for (lVar4 = 0; lVar4 != 0x2c; lVar4 = lVar4 + 4) {
      test_case.m_dst_target = *(GLenum *)((long)&s_valid_targets + lVar4);
      test_case.m_expected_result = 0;
      if (uVar3 < 2 != (int)lVar2 - 5U < 2) {
        test_case.m_expected_result = 0x502;
      }
      test_case.m_src_target = GVar1;
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(this_00,&test_case);
      uVar3 = uVar3 + 1;
    }
  }
  for (lVar2 = 0; lVar2 != 0x11; lVar2 = lVar2 + 1) {
    GVar1 = (&s_invalid_targets)[lVar2];
    for (lVar4 = 0; lVar4 != 0x44; lVar4 = lVar4 + 4) {
      test_case.m_dst_target = *(GLenum *)((long)&s_invalid_targets + lVar4);
      test_case.m_expected_result = 0x500;
      test_case.m_src_target = GVar1;
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(this_00,&test_case);
    }
  }
  for (lVar2 = 0; lVar2 != 0x11; lVar2 = lVar2 + 1) {
    GVar1 = (&s_invalid_targets)[lVar2];
    for (lVar4 = 0; lVar4 != 0x2c; lVar4 = lVar4 + 4) {
      test_case.m_dst_target = *(GLenum *)((long)&s_valid_targets + lVar4);
      test_case.m_expected_result = 0x500;
      test_case.m_src_target = GVar1;
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(this_00,&test_case);
    }
  }
  for (lVar2 = 0; lVar2 != 0xb; lVar2 = lVar2 + 1) {
    GVar1 = (&s_valid_targets)[lVar2];
    for (lVar4 = 0; lVar4 != 0x44; lVar4 = lVar4 + 4) {
      test_case.m_dst_target = *(GLenum *)((long)&s_invalid_targets + lVar4);
      test_case.m_expected_result = 0x500;
      test_case.m_src_target = GVar1;
      std::
      vector<gl4cts::CopyImage::InvalidTargetTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidTargetTest::testCase>_>
      ::push_back(this_00,&test_case);
    }
  }
  return;
}

Assistant:

InvalidTargetTest::InvalidTargetTest(deqp::Context& context)
	: TestCase(context, "invalid_target",
			   "Test verifies if INVALID_ENUM is generated when invalid target is provided to CopySubImageData")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{

	/* Valid source, valid dst */
	for (GLuint src = 0; src < s_n_valid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum src_target = s_valid_targets[src];
			const GLenum dst_target = s_valid_targets[dst];
			testCase	 test_case  = { src_target, dst_target, GL_NO_ERROR };

			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				test_case.m_expected_result = GL_INVALID_OPERATION;
			}

			m_test_cases.push_back(test_case);
		}
	}

	/* Invalid source, invalid dst */
	for (GLuint src = 0; src < s_n_invalid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_invalid_targets; ++dst)
		{
			const GLenum   src_target = s_invalid_targets[src];
			const GLenum   dst_target = s_invalid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}

	/* Invalid source, valid dst */
	for (GLuint src = 0; src < s_n_invalid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum   src_target = s_invalid_targets[src];
			const GLenum   dst_target = s_valid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}

	/* Valid source, invalid dst */
	for (GLuint src = 0; src < s_n_valid_targets; ++src)
	{
		for (GLuint dst = 0; dst < s_n_invalid_targets; ++dst)
		{
			const GLenum   src_target = s_valid_targets[src];
			const GLenum   dst_target = s_invalid_targets[dst];
			const testCase test_case  = { src_target, dst_target, GL_INVALID_ENUM };

			m_test_cases.push_back(test_case);
		}
	}
}